

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O3

void check_sockname(sockaddr *addr,char *compare_ip,int compare_port,char *context)

{
  int iVar1;
  void *pvVar2;
  undefined8 *extraout_RDX;
  undefined1 *__size;
  sockaddr_in check_addr;
  sockaddr_in compare_addr;
  char check_ip [17];
  undefined4 local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  short local_38;
  short local_36;
  int local_34;
  undefined1 local_28 [24];
  
  local_48._0_2_ = addr->sa_family;
  local_48._2_1_ = addr->sa_data[0];
  local_48._3_1_ = addr->sa_data[1];
  iStack_44 = *(int *)(addr->sa_data + 2);
  uStack_40 = *(undefined4 *)(addr->sa_data + 6);
  uStack_3c = *(undefined4 *)(addr->sa_data + 10);
  __size = (undefined1 *)(ulong)(uint)compare_port;
  iVar1 = uv_ip4_addr(compare_ip,__size,&local_38);
  if (iVar1 == 0) {
    if ((short)local_48 != 2) goto LAB_0015c285;
    if (local_38 != 2) goto LAB_0015c28a;
    if (iStack_44 != local_34) goto LAB_0015c28f;
    if ((compare_port != 0) && (local_48._2_2_ != local_36)) goto LAB_0015c299;
    __size = local_28;
    iVar1 = uv_ip4_name(&local_48,__size,0x11);
    if (iVar1 == 0) {
      printf("%s: %s:%d\n",context,local_28,
             (ulong)(ushort)(local_48._2_2_ << 8 | local_48._2_2_ >> 8));
      return;
    }
  }
  else {
    check_sockname_cold_1();
LAB_0015c285:
    check_sockname_cold_2();
LAB_0015c28a:
    check_sockname_cold_3();
LAB_0015c28f:
    check_sockname_cold_4();
  }
  check_sockname_cold_6();
LAB_0015c299:
  check_sockname_cold_5();
  pvVar2 = malloc((size_t)__size);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void check_sockname(struct sockaddr* addr, const char* compare_ip,
  int compare_port, const char* context) {
  struct sockaddr_in check_addr = *(struct sockaddr_in*) addr;
  struct sockaddr_in compare_addr;
  char check_ip[17];
  int r;

  ASSERT(0 == uv_ip4_addr(compare_ip, compare_port, &compare_addr));

  /* Both addresses should be ipv4 */
  ASSERT(check_addr.sin_family == AF_INET);
  ASSERT(compare_addr.sin_family == AF_INET);

  /* Check if the ip matches */
  ASSERT(memcmp(&check_addr.sin_addr,
         &compare_addr.sin_addr,
         sizeof compare_addr.sin_addr) == 0);

  /* Check if the port matches. If port == 0 anything goes. */
  ASSERT(compare_port == 0 || check_addr.sin_port == compare_addr.sin_port);

  r = uv_ip4_name(&check_addr, (char*) check_ip, sizeof check_ip);
  ASSERT(r == 0);

  printf("%s: %s:%d\n", context, check_ip, ntohs(check_addr.sin_port));
}